

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O0

bool __thiscall
chrono::ChArchiveExplorer::IsObject<std::vector<myEmployee,std::allocator<myEmployee>>>
          (ChArchiveExplorer *this,vector<myEmployee,_std::allocator<myEmployee>_> *root)

{
  char in_R9B;
  ChNameValue<std::vector<myEmployee,_std::allocator<myEmployee>_>_> local_70;
  allocator local_41;
  string local_40;
  vector<myEmployee,_std::allocator<myEmployee>_> *local_20;
  vector<myEmployee,_std::allocator<myEmployee>_> *root_local;
  ChArchiveExplorer *this_local;
  
  local_20 = root;
  root_local = (vector<myEmployee,_std::allocator<myEmployee>_> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"_",&local_41);
  PrepareSearch(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  make_ChNameValue<std::vector<myEmployee,std::allocator<myEmployee>>>
            (&local_70,(chrono *)"root",(char *)local_20,
             (vector<myEmployee,_std::allocator<myEmployee>_> *)0x19db55,(char *)0x0,in_R9B);
  ChArchiveOut::operator<<(&this->super_ChArchiveOut,&local_70);
  ChNameValue<std::vector<myEmployee,_std::allocator<myEmployee>_>_>::~ChNameValue(&local_70);
  return (this->found_obj & 1U) != 0;
}

Assistant:

bool IsObject(const T& root) {

          this->PrepareSearch("_");
          this->operator<<( CHNVP(root,"") ); // SCAN! 
          if (this->found_obj) 
              return true;
          else 
              return false;
      }